

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O2

int wally_map_clear(wally_map *map_in)

{
  wally_map_item *p;
  long lVar1;
  ulong uVar2;
  
  if (map_in != (wally_map *)0x0) {
    lVar1 = 0;
    uVar2 = 0;
    while( true ) {
      p = map_in->items;
      if (map_in->num_items <= uVar2) break;
      clear_and_free(*(void **)((long)&p->key + lVar1),*(size_t *)((long)&p->key_len + lVar1));
      clear_and_free(*(void **)((long)&map_in->items->value + lVar1),
                     *(size_t *)((long)&map_in->items->value_len + lVar1));
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x20;
    }
    clear_and_free(p,map_in->num_items << 5);
    wally_clear(map_in,0x18);
    return 0;
  }
  return -2;
}

Assistant:

int wally_map_clear(struct wally_map *map_in)
{
    size_t i;

    if (!map_in)
        return WALLY_EINVAL;
    for (i = 0; i < map_in->num_items; ++i) {
        clear_and_free(map_in->items[i].key, map_in->items[i].key_len);
        clear_and_free(map_in->items[i].value, map_in->items[i].value_len);
    }
    clear_and_free(map_in->items, map_in->num_items * sizeof(*map_in->items));
    wally_clear(map_in, sizeof(*map_in));
    return WALLY_OK;
}